

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O3

bool __thiscall
moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
::ImplicitProducer::new_block_index(ImplicitProducer *this)

{
  __pointer_type pBVar1;
  size_t sVar2;
  __int_type_conflict _Var3;
  __pointer_type pBVar4;
  BlockIndexEntry *pBVar5;
  BlockIndexEntry **ppBVar6;
  size_t sVar7;
  size_t sVar8;
  BlockIndexEntry *pBVar9;
  __int_type_conflict _Var10;
  size_t sVar11;
  size_t sVar12;
  
  pBVar1 = (this->blockIndex)._M_b._M_p;
  if (pBVar1 == (__pointer_type)0x0) {
    sVar12 = 0;
  }
  else {
    sVar12 = pBVar1->capacity;
  }
  sVar2 = this->nextBlockIndexCapacity;
  sVar11 = sVar12;
  if (pBVar1 == (__pointer_type)0x0) {
    sVar11 = sVar2;
  }
  pBVar4 = (__pointer_type)malloc(sVar2 * 8 + 0x36 + sVar11 * 0x10);
  if (pBVar4 != (__pointer_type)0x0) {
    pBVar5 = (BlockIndexEntry *)((long)&pBVar4[1].capacity + (ulong)(-((int)pBVar4 + 0x28) & 7));
    pBVar9 = pBVar5 + sVar11;
    if (pBVar1 != (__pointer_type)0x0) {
      _Var3 = (pBVar1->tail).super___atomic_base<unsigned_long>._M_i;
      sVar7 = pBVar1->capacity;
      ppBVar6 = pBVar1->index;
      sVar8 = 0;
      _Var10 = _Var3;
      do {
        _Var10 = _Var10 + 1 & sVar7 - 1;
        (&pBVar9->key)[sVar8].super___atomic_base<unsigned_long>._M_i =
             (__int_type_conflict)ppBVar6[_Var10];
        sVar8 = sVar8 + 1;
      } while (_Var10 != _Var3);
      if (sVar12 != sVar8) {
        __assert_fail("i == prevCapacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/concurrentqueue.h"
                      ,0xb46,
                      "bool moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo *>::ImplicitProducer::new_block_index() [T = loop::MessageLoop::TaskInfo *, Traits = moodycamel::ConcurrentQueueDefaultTraits]"
                     );
      }
    }
    ppBVar6 = (BlockIndexEntry **)
              ((long)&(pBVar9->key).super___atomic_base<unsigned_long>._M_i +
              (ulong)(-(int)pBVar9 & 7));
    if (sVar11 != 0) {
      sVar7 = 0;
      pBVar9 = pBVar5;
      do {
        (pBVar9->key).super___atomic_base<unsigned_long>._M_i = 1;
        ppBVar6[sVar12 + sVar7] = pBVar9;
        sVar7 = sVar7 + 1;
        pBVar9 = pBVar9 + 1;
      } while (sVar11 != sVar7);
    }
    pBVar4->prev = pBVar1;
    pBVar4->entries = pBVar5;
    pBVar4->index = ppBVar6;
    pBVar4->capacity = sVar2;
    (pBVar4->tail).super___atomic_base<unsigned_long>._M_i = sVar2 - 1 & sVar12 - 1;
    (this->blockIndex)._M_b._M_p = pBVar4;
    this->nextBlockIndexCapacity = sVar2 * 2;
  }
  return pBVar4 != (__pointer_type)0x0;
}

Assistant:

bool new_block_index()
		{
			auto prev = blockIndex.load(std::memory_order_relaxed);
			size_t prevCapacity = prev == nullptr ? 0 : prev->capacity;
			auto entryCount = prev == nullptr ? nextBlockIndexCapacity : prevCapacity;
			auto raw = static_cast<char*>((Traits::malloc)(
				sizeof(BlockIndexHeader) +
				std::alignment_of<BlockIndexEntry>::value - 1 + sizeof(BlockIndexEntry) * entryCount +
				std::alignment_of<BlockIndexEntry*>::value - 1 + sizeof(BlockIndexEntry*) * nextBlockIndexCapacity));
			if (raw == nullptr) {
				return false;
			}
			
			auto header = new (raw) BlockIndexHeader;
			auto entries = reinterpret_cast<BlockIndexEntry*>(details::align_for<BlockIndexEntry>(raw + sizeof(BlockIndexHeader)));
			auto index = reinterpret_cast<BlockIndexEntry**>(details::align_for<BlockIndexEntry*>(reinterpret_cast<char*>(entries) + sizeof(BlockIndexEntry) * entryCount));
			if (prev != nullptr) {
				auto prevTail = prev->tail.load(std::memory_order_relaxed);
				auto prevPos = prevTail;
				size_t i = 0;
				do {
					prevPos = (prevPos + 1) & (prev->capacity - 1);
					index[i++] = prev->index[prevPos];
				} while (prevPos != prevTail);
				assert(i == prevCapacity);
			}
			for (size_t i = 0; i != entryCount; ++i) {
				new (entries + i) BlockIndexEntry;
				entries[i].key.store(INVALID_BLOCK_BASE, std::memory_order_relaxed);
				index[prevCapacity + i] = entries + i;
			}
			header->prev = prev;
			header->entries = entries;
			header->index = index;
			header->capacity = nextBlockIndexCapacity;
			header->tail.store((prevCapacity - 1) & (nextBlockIndexCapacity - 1), std::memory_order_relaxed);
			
			blockIndex.store(header, std::memory_order_release);
			
			nextBlockIndexCapacity <<= 1;
			
			return true;
		}